

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O0

void __thiscall
ConfidentialAssetId_Constractor_hex33_version0_Test::TestBody
          (ConfidentialAssetId_Constractor_hex33_version0_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1c0;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_;
  Message local_170;
  ByteData local_168;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  bool local_10a;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  int local_e4;
  ByteData local_e0;
  size_t local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  string local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  ConfidentialAssetId assetid;
  ConfidentialAssetId_Constractor_hex33_version0_Test *this_local;
  
  assetid._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,
             "007f0c8d0a4e6fb92c63893345facbd99dc603dc1cd18c73e5700bd9a0babb1f0b",&local_59);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_a0,(ConfidentialAssetId *)local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_80,"assetid.GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  cfd::core::ConfidentialAssetId::GetData(&local_e0,(ConfidentialAssetId *)local_38);
  local_c8 = cfd::core::ByteData::GetDataSize(&local_e0);
  local_e4 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_c0,"assetid.GetData().GetDataSize()","0",&local_c8,&local_e4);
  cfd::core::ByteData::~ByteData(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_109 = cfd::core::ConfidentialAssetId::HasBlinding((ConfidentialAssetId *)local_38);
  local_10a = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_108,"assetid.HasBlinding()","false",&local_109,&local_10a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  cfd::core::ConfidentialAssetId::GetUnblindedData(&local_168,(ConfidentialAssetId *)local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_150,&local_168);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_130,"assetid.GetUnblindedData().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_150);
  cfd::core::ByteData::~ByteData(&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_189 = cfd::core::ConfidentialAssetId::IsEmpty((ConfidentialAssetId *)local_38);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_188,&local_189,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c0,(internal *)local_188,(AssertionResult *)"assetid.IsEmpty()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_38);
  return;
}

Assistant:

TEST(ConfidentialAssetId, Constractor_hex33_version0) {
  // 33byte
  ConfidentialAssetId assetid(
      "007f0c8d0a4e6fb92c63893345facbd99dc603dc1cd18c73e5700bd9a0babb1f0b");
  EXPECT_STREQ(assetid.GetHex().c_str(), "");
  EXPECT_EQ(assetid.GetData().GetDataSize(), 0);
  EXPECT_EQ(assetid.HasBlinding(), false);
  EXPECT_STREQ(assetid.GetUnblindedData().GetHex().c_str(), "");
  EXPECT_TRUE(assetid.IsEmpty());
}